

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O0

void __thiscall recursive_combat::frame_t::frame_t(frame_t *this,frame_t *param_1)

{
  frame_t *param_1_local;
  frame_t *this_local;
  
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&this->p1d,&param_1->p1d);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&this->p2d,&param_1->p2d);
  std::
  unordered_set<std::pair<std::deque<unsigned_long,_std::allocator<unsigned_long>_>,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>,_game_hasher,_std::equal_to<std::pair<std::deque<unsigned_long,_std::allocator<unsigned_long>_>,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::pair<std::deque<unsigned_long,_std::allocator<unsigned_long>_>,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_set(&this->hist,&param_1->hist);
  return;
}

Assistant:

auto recursive_combat(deck_t::cards_t& first, deck_t::cards_t& second) {
  struct frame_t {
    deck_t::cards_t p1d, p2d;
    std::unordered_set<game_t, game_hasher> hist {};
  };
  auto stack = std::vector<frame_t> { {first, second} };
  struct ret_t { bool c1_wins; };
  auto ret = std::optional<ret_t> { std::nullopt };
  for (;;) {
    auto& ctx = stack.back();

    auto c1 = ctx.p1d.front(), c2 = ctx.p2d.front();

    bool c1_wins;

    if (ret) {
      c1_wins = ret->c1_wins;
      ret = std::nullopt;
    } else {

      // anti-loop check
      auto game = game_t{ctx.p1d, ctx.p2d};
      auto has_loop = ctx.hist.contains(game);

      // check if anyone has won
      if (ctx.p1d.empty() || ctx.p2d.empty() || has_loop) {
        if (stack.size() > 1) {
          stack.pop_back();
          ret = { has_loop || ctx.p2d.empty() }; // return the winner
          continue;
        } else {
          break;
        }
      }

      ctx.hist.insert(game);

      if (ctx.p1d.size() > c1 && ctx.p2d.size() > c2) {
        // recursive pla
        auto next = frame_t {};
        ranges::copy_n(ctx.p1d.cbegin()+1, c1, std::back_inserter(next.p1d));
        ranges::copy_n(ctx.p2d.cbegin()+1, c2, std::back_inserter(next.p2d));
        stack.emplace_back(next);
        continue; // we'll get the result in a later iteration
      } else {
        // regular play
        c1_wins = c1 > c2;
      }
    }

    ctx.p1d.pop_front(); ctx.p2d.pop_front();
    if (c1_wins) {
      ctx.p1d.push_back(c1);
      ctx.p1d.push_back(c2);
    } else {
      ctx.p2d.push_back(c2);
      ctx.p2d.push_back(c1);
    }
  }

  first = stack.back().p1d;
  second = stack.back().p2d;
}